

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> * __thiscall
kratos::Simulator::get_complex_value_
          (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           *__return_storage_ptr__,Simulator *this,Var *var)

{
  pointer *this_00;
  uint uVar1;
  pointer puVar2;
  int iVar3;
  undefined4 extraout_var;
  pair<unsigned_int,_unsigned_int> pVar4;
  const_iterator cVar5;
  mapped_type *pmVar6;
  InternalException *this_01;
  initializer_list<unsigned_long> __l;
  optional<unsigned_long> oVar7;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  _Storage<unsigned_long,_true> local_80;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  index;
  mapped_type values;
  Var *local_48;
  Var *var_local;
  Var *root;
  Var *root_00;
  
  if (var == (Var *)0x0) {
LAB_001c0789:
    (__return_storage_ptr__->
    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _M_engaged = false;
    return __return_storage_ptr__;
  }
  puVar2 = (var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_48 = var;
  if (((long)(var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)puVar2 == 4) && (*puVar2 == 1)) {
    oVar7 = get_value_(this,var);
    local_80._M_value =
         oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    if (((undefined1  [16])
         oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      this_00 = &index.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_80;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,__l,
                 (allocator_type *)&local_98);
      *(pointer *)
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl = index.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      index.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_engaged = true;
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
      return __return_storage_ptr__;
    }
    goto LAB_001c0789;
  }
  if (var->type_ != Slice) {
    cVar5 = std::
            _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->complex_values_)._M_h,&local_48);
    if (cVar5.
        super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      pmVar6 = std::__detail::
               _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->complex_values_,&local_48);
      std::_Optional_payload_base<std::vector<unsigned_long,std::allocator<unsigned_long>>>::
      _Optional_payload_base<std::vector<unsigned_long,std::allocator<unsigned_long>>const&>
                ((_Optional_payload_base<std::vector<unsigned_long,std::allocator<unsigned_long>>> *
                 )__return_storage_ptr__,pmVar6);
      return __return_storage_ptr__;
    }
    goto LAB_001c0789;
  }
  iVar3 = (*(var->super_IRNode)._vptr_IRNode[0x28])(var);
  root_00 = (Var *)CONCAT44(extraout_var,iVar3);
  var_local = root_00;
  get_slice_index((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&local_80,this,var);
  if ((pointer)local_80._M_value !=
      index.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pVar4 = compute_var_high_low
                      (root_00,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                *)&local_80);
    uVar1 = root_00->var_width_;
    if (((int)(((ulong)pVar4 >> 0x20) % (ulong)uVar1) != 0) ||
       ((int)(((ulong)pVar4 & 0xffffffff) % (ulong)uVar1) != uVar1 - 1)) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &index.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"Misaligned vector slicing",
                 (allocator<char> *)&local_98);
      InternalException::InternalException
                (this_01,(string *)
                         &index.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar5 = std::
            _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->complex_values_)._M_h,&var_local);
    if (cVar5.
        super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      pmVar6 = std::__detail::
               _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->complex_values_,&var_local);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &index.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pmVar6);
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_98,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(index.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage +
                   ((ulong)pVar4 >> 0x20) / (ulong)var_local->var_width_),
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_start +
                   ((ulong)pVar4 & 0xffffffff) / (ulong)var_local->var_width_ + 1),
                 (allocator_type *)((long)&root + 7));
      *(pointer *)
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl = local_98._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = local_98._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_98._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_engaged = true;
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_98);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &index.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      goto LAB_001c0793;
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>).
  _M_payload.
  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
  .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  _M_engaged = false;
LAB_001c0793:
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<uint64_t>> Simulator::get_complex_value_(const kratos::Var *var) const {
    if (!var) return std::nullopt;
    if (var->size().size() == 1 && var->size().front() == 1) {
        // this is a scalar
        auto v = get_value_(var);
        if (v)
            return std::vector<uint64_t>{*v};
        else
            return std::nullopt;
    }
    if (var->type() == VarType::Slice) {
        auto const *root = var->get_var_root_parent();
        auto index = get_slice_index(var);
        if (index.empty()) return std::nullopt;
        auto const [var_high, var_low] = compute_var_high_low(root, index);
        if (var_low % root->var_width() != 0 ||
            (var_high % root->var_width() != root->var_width() - 1))
            throw InternalException("Misaligned vector slicing");
        if (complex_values_.find(root) == complex_values_.end()) return std::nullopt;
        auto values = complex_values_.at(root);
        // compute the slice range
        auto low = var_low / root->var_width();
        auto high = var_high / root->var_width();
        return std::vector<uint64_t>(values.begin() + low, values.end() + high + 1);
    } else {
        if (complex_values_.find(var) == complex_values_.end()) return std::nullopt;
        return complex_values_.at(var);
    }
}